

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall kj::anon_unknown_9::DiskFilesystem::DiskFilesystem(DiskFilesystem *this)

{
  int iVar1;
  void *pvVar2;
  OwnFd local_180;
  bool local_179;
  bool _kj_shouldLog;
  Fault f;
  SyscallResult local_160 [2];
  SyscallResult _kjSyscallResult;
  int error;
  int _kjSyscallError;
  stat fsRoot;
  stat realRoot;
  OwnFd local_14;
  DiskFilesystem *local_10;
  DiskFilesystem *this_local;
  
  local_10 = this;
  Filesystem::Filesystem(&this->super_Filesystem);
  (this->super_Filesystem)._vptr_Filesystem = (_func_int **)&PTR_getRoot_00c15a98;
  openDir((char *)&local_14);
  DiskDirectory::DiskDirectory(&this->root,&local_14);
  OwnFd::~OwnFd(&local_14);
  openDir((char *)(realRoot.__glibc_reserved + 2));
  DiskDirectory::DiskDirectory(&this->current,(OwnFd *)(realRoot.__glibc_reserved + 2));
  OwnFd::~OwnFd((OwnFd *)(realRoot.__glibc_reserved + 2));
  computeCurrentPath();
  __kjSyscallResult = (stat *)(fsRoot.__glibc_reserved + 2);
  iVar1 = kj::_::Debug::
          syscallError<kj::(anonymous_namespace)::DiskFilesystem::DiskFilesystem()::_lambda()_1_>
                    ((anon_class_8_1_b4a6751e *)&_kjSyscallResult,false);
  if (iVar1 == 0) {
    f.exception = (Exception *)this;
    local_160[0] = kj::_::Debug::
                   syscall<kj::(anonymous_namespace)::DiskFilesystem::DiskFilesystem()::_lambda()_2_>
                             ((anon_class_16_2_3d64a34a *)&f,false);
    pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_160);
    if (pvVar2 == (void *)0x0) {
      iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(local_160);
      kj::_::Debug::Fault::Fault
                ((Fault *)&stack0xfffffffffffffe88,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x675,iVar1,"fstat(root.DiskHandle::getFd(), &fsRoot)","");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffe88);
    }
    if (realRoot.st_dev != fsRoot.st_dev) {
      local_179 = kj::_::Debug::shouldLog(WARNING);
      while (local_179 != false) {
        kj::_::Debug::log<char_const(&)[75]>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x677,WARNING,
                   "\"root dir file descriptor is broken, probably because of qemu; compensating\"",
                   (char (*) [75])
                   "root dir file descriptor is broken, probably because of qemu; compensating");
        local_179 = false;
      }
      openDir((char *)&local_180);
      DiskHandle::setFd(&(this->root).super_DiskHandle,&local_180);
      OwnFd::~OwnFd(&local_180);
    }
  }
  return;
}

Assistant:

DiskFilesystem()
      : root(openDir("/")),
        current(openDir(".")),
        currentPath(computeCurrentPath()) {
    // We sometimes like to use qemu-user to test arm64 binaries cross-compiled from an x64 host
    // machine. But, because it intercepts and rewrites system calls from userspace rather than
    // emulating a whole kernel, it has a lot of quirks. One quirk that hits kj::Filesystem pretty
    // badly is that open("/") actually returns a file descriptor for "/usr/aarch64-linux-gnu".
    // Attempts to openat() any files within there then don't work. We can detect this problem and
    // correct for it here.
    struct stat realRoot, fsRoot;
    KJ_SYSCALL_HANDLE_ERRORS(stat("/dev/..", &realRoot)) {
      default:
        // stat("/dev/..") failed? Give up.
        return;
    }
    KJ_SYSCALL(fstat(root.DiskHandle::getFd(), &fsRoot));
    if (realRoot.st_ino != fsRoot.st_ino) {
      KJ_LOG(WARNING, "root dir file descriptor is broken, probably because of qemu; compensating");
      root.setFd(openDir("/dev/.."));
    }
  }